

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinder_Declarators.cpp
# Opt level: O3

Action __thiscall
psy::C::DeclarationBinder::visitParameterDeclaration_AtDeclarator
          (DeclarationBinder *this,ParameterDeclarationSyntax *node)

{
  Action AVar1;
  
  AVar1 = SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->decltor_->super_SyntaxNode);
  if (AVar1 == Quit) {
    return Quit;
  }
  typeDeclarationAtTopWithTypeAtTop(this);
  popTypesUntilNonDerivedDeclaratorType(this);
  AVar1 = visitParameterDeclaration_AtEnd(this,node);
  return AVar1;
}

Assistant:

SyntaxVisitor::Action DeclarationBinder::visitParameterDeclaration_AtDeclarator(
        const ParameterDeclarationSyntax* node)
{
    return visit_AtSingleDeclarator_COMMON(
                node,
                &DeclarationBinder::visitParameterDeclaration_AtEnd);
}